

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O0

void __thiscall cmsys::Glob::AddExpression(Glob *this,string *expr)

{
  GlobInternals *pGVar1;
  string local_38;
  string *local_18;
  string *expr_local;
  Glob *this_local;
  
  pGVar1 = this->Internals;
  local_18 = expr;
  expr_local = (string *)this;
  PatternToRegex(&local_38,expr,true,false);
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<std::__cxx11::string>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
             &pGVar1->Expressions,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Glob::AddExpression(const std::string& expr)
{
  this->Internals->Expressions.emplace_back(this->PatternToRegex(expr));
}